

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
CompilerIdNode::EvaluateWithLanguage
          (string *__return_storage_ptr__,CompilerIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4,string *lang)

{
  cmMakefile *this_00;
  pointer pbVar1;
  pointer pcVar2;
  cmGeneratorExpressionContext *backtrace;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  long *plVar6;
  string *psVar7;
  cmake *this_01;
  size_type *psVar8;
  PolicyID id;
  char *pcVar9;
  char *pcVar10;
  pointer pbVar11;
  string local_88;
  string *local_68;
  cmGeneratorExpressionContext *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  GeneratorExpressionContent *local_38;
  
  this_00 = context->LG->Makefile;
  local_60 = context;
  local_38 = content;
  std::operator+(&local_58,"CMAKE_",lang);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88.field_2._8_8_ = plVar6[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_88._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  psVar7 = cmMakefile::GetSafeDefinition(this_00,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pbVar11 = (parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar11 ==
      (parameters->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar7->_M_string_length);
  }
  else {
    if (psVar7->_M_string_length == 0) {
      bVar3 = pbVar11->_M_string_length == 0;
      pcVar10 = "0";
      if (bVar3) {
        pcVar10 = "1";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "";
      if (bVar3) {
        pcVar9 = "";
      }
    }
    else {
      local_68 = __return_storage_ptr__;
      if ((EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
           ::compilerIdValidator == '\0') &&
         (iVar4 = __cxa_guard_acquire(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                                       ::compilerIdValidator), iVar4 != 0)) {
        EvaluateWithLanguage::compilerIdValidator.regmust = (char *)0x0;
        EvaluateWithLanguage::compilerIdValidator.program = (char *)0x0;
        EvaluateWithLanguage::compilerIdValidator.progsize = 0;
        memset(&EvaluateWithLanguage::compilerIdValidator,0,0xaa);
        cmsys::RegularExpression::compile
                  (&EvaluateWithLanguage::compilerIdValidator,"^[A-Za-z0-9_]*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &EvaluateWithLanguage::compilerIdValidator,&__dso_handle);
        __cxa_guard_release(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                             ::compilerIdValidator);
      }
      pbVar1 = (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar11 = (parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
          pbVar11 = pbVar11 + 1) {
        bVar3 = cmsys::RegularExpression::find
                          (&EvaluateWithLanguage::compilerIdValidator,(pbVar11->_M_dataplus)._M_p,
                           &EvaluateWithLanguage::compilerIdValidator.regmatch);
        if (!bVar3) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,local_38);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Expression syntax not recognized.","");
          reportError(local_60,&local_88,&local_58);
          psVar7 = local_68;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_local_buf[0] = '\0';
          return psVar7;
        }
        pcVar10 = (pbVar11->_M_dataplus)._M_p;
        pcVar9 = (psVar7->_M_dataplus)._M_p;
        iVar4 = strcmp(pcVar10,pcVar9);
        if (iVar4 == 0) {
LAB_0056f789:
          (local_68->_M_dataplus)._M_p = (pointer)&local_68->field_2;
          pcVar10 = "1";
          pcVar9 = "";
          __return_storage_ptr__ = local_68;
          goto LAB_0056f7a3;
        }
        iVar4 = cmsysString_strcasecmp(pcVar10,pcVar9);
        if (iVar4 == 0) {
          PVar5 = cmLocalGenerator::GetPolicyStatus(local_60->LG,CMP0044);
          backtrace = local_60;
          if (PVar5 != OLD) {
            if (PVar5 != WARN) goto LAB_0056f632;
            this_01 = cmLocalGenerator::GetCMakeInstance(local_60->LG);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_88,(cmPolicies *)0x2c,id);
            cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_88,&backtrace->Backtrace);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_0056f789;
        }
LAB_0056f632:
      }
      (local_68->_M_dataplus)._M_p = (pointer)&local_68->field_2;
      pcVar10 = "0";
      pcVar9 = "";
      __return_storage_ptr__ = local_68;
    }
LAB_0056f7a3:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar9)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateWithLanguage(const std::vector<std::string>& parameters,
                                   cmGeneratorExpressionContext* context,
                                   const GeneratorExpressionContent* content,
                                   cmGeneratorExpressionDAGChecker* /*unused*/,
                                   const std::string& lang) const
  {
    std::string const& compilerId =
      context->LG->GetMakefile()->GetSafeDefinition("CMAKE_" + lang +
                                                    "_COMPILER_ID");
    if (parameters.empty()) {
      return compilerId;
    }
    if (compilerId.empty()) {
      return parameters.front().empty() ? "1" : "0";
    }
    static cmsys::RegularExpression compilerIdValidator("^[A-Za-z0-9_]*$");

    for (auto const& param : parameters) {

      if (!compilerIdValidator.find(param)) {
        reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
        return std::string();
      }

      if (strcmp(param.c_str(), compilerId.c_str()) == 0) {
        return "1";
      }

      if (cmsysString_strcasecmp(param.c_str(), compilerId.c_str()) == 0) {
        switch (context->LG->GetPolicyStatus(cmPolicies::CMP0044)) {
          case cmPolicies::WARN: {
            context->LG->GetCMakeInstance()->IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmPolicies::GetPolicyWarning(cmPolicies::CMP0044),
              context->Backtrace);
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            return "1";
          case cmPolicies::NEW:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
            break;
        }
      }
    }
    return "0";
  }